

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dialog_widgets.cpp
# Opt level: O1

void do_abort_waiting_for_dialog_proc(Am_Object *cmd)

{
  bool bVar1;
  Am_Object widget;
  Am_Object AStack_28;
  Am_Object local_20;
  Am_Value local_18;
  
  Am_Object::Get_Object(&local_20,(Am_Slot_Key)cmd,10);
  bVar1 = Am_Object::Valid(&local_20);
  if (bVar1) {
    Am_Object::Am_Object(&AStack_28,&local_20);
    local_18.type = 3;
    local_18.value.wrapper_value = (Am_Wrapper *)0x0;
    Am_Finish_Pop_Up_Waiting(&AStack_28,&local_18);
    Am_Value::~Am_Value(&local_18);
    Am_Object::~Am_Object(&AStack_28);
  }
  Am_Object::~Am_Object(&local_20);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, do_abort_waiting_for_dialog,
                 (Am_Object cmd))
{
  Am_Object widget = cmd.Get_Owner();
  if (widget.Valid())
    Am_Finish_Pop_Up_Waiting(widget, (0L));
}